

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_dodsp(_glist *x,int toplevel,t_signal **sp)

{
  int iVar1;
  int noutlets;
  t_symbol *s;
  _dspcontext *dc;
  t_object *obj;
  t_gotfn p_Var2;
  _outconnect *p_Var3;
  t_gobj *x_00;
  t_linetraverser t;
  t_linetraverser local_a8;
  
  s = gensym("dsp");
  iVar1 = obj_nsiginlets(&x->gl_obj);
  noutlets = obj_nsigoutlets(&x->gl_obj);
  dc = ugen_start_graph(toplevel,sp,iVar1,noutlets);
  for (x_00 = x->gl_list; x_00 != (t_gobj *)0x0; x_00 = x_00->g_next) {
    obj = pd_checkobject(&x_00->g_pd);
    if ((obj != (t_object *)0x0) && (p_Var2 = zgetfn(&x_00->g_pd,s), p_Var2 != (t_gotfn)0x0)) {
      ugen_add(dc,obj);
    }
  }
  local_a8.tr_ob = (t_object *)0x0;
  local_a8.tr_nextoc = (_outconnect *)0x0;
  local_a8.tr_nout = 0;
  local_a8.tr_nextoutno = 0;
  local_a8.tr_x = x;
  p_Var3 = linetraverser_next(&local_a8);
  while (p_Var3 != (_outconnect *)0x0) {
    iVar1 = obj_issignaloutlet(local_a8.tr_ob,local_a8.tr_outno);
    if (iVar1 != 0) {
      ugen_connect(dc,local_a8.tr_ob,local_a8.tr_outno,local_a8.tr_ob2,local_a8.tr_inno);
    }
    p_Var3 = linetraverser_next(&local_a8);
  }
  ugen_done_graph(dc);
  return;
}

Assistant:

void canvas_dodsp(t_canvas *x, int toplevel, t_signal **sp)
{
    t_linetraverser t;
    t_outconnect *oc;
    t_gobj *y;
    t_object *ob;
    t_symbol *dspsym = gensym("dsp");
    t_dspcontext *dc;

        /* create a new "DSP graph" object to use in sorting this canvas.
        If we aren't toplevel, there are already other dspcontexts around. */

    dc = ugen_start_graph(toplevel, sp,
        obj_nsiginlets(&x->gl_obj),
        obj_nsigoutlets(&x->gl_obj));

        /* find all the "dsp" boxes and add them to the graph */

    for (y = x->gl_list; y; y = y->g_next)
        if ((ob = pd_checkobject(&y->g_pd)) && zgetfn(&y->g_pd, dspsym))
            ugen_add(dc, ob);

        /* ... and all dsp interconnections */
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
        if (obj_issignaloutlet(t.tr_ob, t.tr_outno))
            ugen_connect(dc, t.tr_ob, t.tr_outno, t.tr_ob2, t.tr_inno);

        /* finally, sort them and add them to the DSP chain */
    ugen_done_graph(dc);
}